

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

int readline(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  int local_3c;
  int local_38;
  int temp;
  int c;
  int i;
  int n;
  int j;
  char num [8];
  char *arg;
  char *ptr;
  
  do {
    for (temp = 0; temp < 0x9e; temp = temp + 1) {
      prlnbuf[temp] = ' ';
    }
    if (expand_macro != 0) {
      if (mlptr == (t_line *)0x0) {
        do {
          if (mlptr != (t_line *)0x0) goto LAB_0010f003;
          midx = midx + -1;
          mlptr = mstack[midx];
          mcounter = mcntstack[midx];
        } while (midx != 0);
        mlptr = (t_line *)0x0;
        expand_macro = 0;
      }
LAB_0010f003:
      if (mlptr != (t_line *)0x0) {
        temp = 0x1a;
        arg = mlptr->data;
        do {
          cVar1 = *arg;
          if (cVar1 == '\0') {
            prlnbuf[temp] = '\0';
            mlptr = mlptr->next;
            return 0;
          }
          if (cVar1 == '\\') {
            pcVar5 = arg + 2;
            iVar2 = (int)arg[1];
            prlnbuf[temp] = '\0';
            if (iVar2 == 0x40) {
              c = 5;
              sprintf((char *)&n,"%05i",(ulong)(uint)mcounter);
              num = (char  [8])&n;
              arg = pcVar5;
            }
            else if (iVar2 == 0x23) {
              i = 9;
              while ((0 < i && (sVar4 = strlen(marg[midx][i + -1]), sVar4 == 0))) {
                i = i + -1;
              }
              c = 1;
              sprintf((char *)&n,"%i",(ulong)(uint)i);
              num = (char  [8])&n;
              arg = pcVar5;
            }
            else if (iVar2 == 0x3f) {
              iVar2 = (int)*pcVar5;
              if ((iVar2 < 0x31) || (0x39 < iVar2)) {
                error("Invalid macro argument index!");
                return -1;
              }
              c = 1;
              uVar3 = macro_getargtype(marg[midx][iVar2 + -0x31]);
              sprintf((char *)&n,"%i",(ulong)uVar3);
              num = (char  [8])&n;
              arg = arg + 3;
            }
            else {
              if ((iVar2 < 0x31) || (0x39 < iVar2)) {
                error("Invalid macro argument index!");
                return -1;
              }
              sVar4 = strlen(marg[midx][iVar2 + -0x31]);
              c = (int)sVar4;
              num = (char  [8])(marg[midx] + (iVar2 + -0x31));
              arg = pcVar5;
            }
            if (0x9c < temp + c) {
              error("Invalid line length!");
              return -1;
            }
            strncpy(prlnbuf + temp,(char *)num,(long)c);
            temp = c + temp;
          }
          else {
            prlnbuf[temp] = cVar1;
            temp = temp + 1;
            arg = arg + 1;
          }
          if (0x9c < temp) {
            temp = 0x9d;
          }
        } while( true );
      }
    }
    temp = 4;
    slnum = slnum + 1;
    for (local_3c = slnum; local_3c != 0; local_3c = local_3c / 10) {
      prlnbuf[temp] = (char)(local_3c % 10) + '0';
      temp = temp + -1;
    }
    temp = 0x1a;
    local_38 = getc((FILE *)in_fp);
    if (local_38 != -1) break;
    iVar2 = close_input();
    if (iVar2 != 0) {
      return -1;
    }
  } while( true );
LAB_0010f3a8:
  if (local_38 == 0xd) {
    iVar2 = getc((FILE *)in_fp);
    if ((iVar2 != 10) && (iVar2 != -1)) {
      ungetc(iVar2,(FILE *)in_fp);
    }
LAB_0010f471:
    prlnbuf[temp] = '\0';
    return 0;
  }
  if ((local_38 == 10) || (local_38 == -1)) goto LAB_0010f471;
  prlnbuf[temp] = (char)local_38;
  temp = (uint)(temp < 0x9e) + temp;
  if (local_38 == 9) {
    prlnbuf[temp + -1] = ' ';
    temp = (8 - (temp + -0x1b) % 8) + temp + -1;
  }
  local_38 = getc((FILE *)in_fp);
  goto LAB_0010f3a8;
}

Assistant:

int
readline(void)
{
	char *ptr, *arg, num[8];
	int j, n;
	int	i;		/* pointer into prlnbuf */
	int	c;		/* current character		*/
	int	temp;	/* temp used for line number conversion */

start:
	for (i = 0; i < LAST_CH_POS; i++)
		prlnbuf[i] = ' ';

	/* if 'expand_macro' is set get a line from macro buffer instead */
	if (expand_macro) {
		if (mlptr == NULL) {
			while (mlptr == NULL) {
				midx--;
				mlptr = mstack[midx];
				mcounter = mcntstack[midx];
				if (midx == 0) {
					mlptr = NULL;
					expand_macro = 0;
					break;
				}
			}
		}

		/* expand line */
		if (mlptr) {
			i = SFIELD;
			ptr = mlptr->data;
			for (;;) {
				c = *ptr++;
				if (c == '\0')
					break;
				if (c != '\\')
					prlnbuf[i++] = c;
				else {
					c = *ptr++;
					prlnbuf[i] = '\0';

					/* \@ */
					if (c == '@') {
						n = 5;
						sprintf(num, "%05i", mcounter);
						arg = num;
					}

					/* \# */
					else if (c == '#') {
						for (j = 9; j > 0; j--)
							if (strlen(marg[midx][j - 1]))
								break;
						n = 1;
						sprintf(num, "%i", j);
						arg = num;
					}

					/* \?1 - \?9 */
					else if (c == '?') {
						c = *ptr++;
						if (c >= '1' && c <= '9') {
							n = 1;
							sprintf(num, "%i", macro_getargtype(marg[midx][c - '1']));
							arg = num;
						}
						else {
							error("Invalid macro argument index!");
							return (-1);
						}
					}

					/* \1 - \9 */
					else if (c >= '1' && c <= '9') {
						j   = c - '1';
						n   = strlen(marg[midx][j]);
						arg = marg[midx][j];
					}

					/* unknown macro special command */
					else {
						error("Invalid macro argument index!");
						return (-1);
					}

					/* check for line overflow */
					if ((i + n) >= LAST_CH_POS - 1) {
						error("Invalid line length!");
						return (-1);
					}

					/* copy macro string */
					strncpy(&prlnbuf[i], arg, n);
					i += n;
				}
				if (i >= LAST_CH_POS - 1)
					i  = LAST_CH_POS - 1;
			}
			prlnbuf[i] = '\0';
			mlptr = mlptr->next;
			return (0);
		}
	}

	/* put source line number into prlnbuf */
	i = 4;
	temp = ++slnum;
	while (temp != 0) {
		prlnbuf[i--] = temp % 10 + '0';
		temp /= 10;
	}

	/* get a line */
	i = SFIELD;
	c = getc(in_fp);
	if (c == EOF) {
		if (close_input())
			return (-1);
		goto start;
	}
	for (;;) {
		/* check for the end of line */
		if (c == '\r') {
			c = getc(in_fp);
			if (c == '\n' || c == EOF)
				break;
			ungetc(c, in_fp);
			break;
		}
		if (c == '\n' || c == EOF)
			break;

		/* store char in the line buffer */
		prlnbuf[i] = c;
		i += (i < LAST_CH_POS) ? 1 : 0;

		/* expand tab char to space */
		if (c == '\t') {
			prlnbuf[--i] = ' ';
			i += (8 - ((i - SFIELD) % 8));
		}

		/* get next char */
		c = getc(in_fp);
	}
	prlnbuf[i] = '\0';
	return(0);
}